

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprSetHeight(Expr *p)

{
  int iVar1;
  uint uVar2;
  Select *pSelect;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int nHeight;
  int local_1c;
  
  if (p->pLeft == (Expr *)0x0) {
    local_1c = 0;
  }
  else {
    local_1c = p->pLeft->nHeight;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_1c < iVar1)) {
    local_1c = iVar1;
  }
  uVar2 = p->flags;
  pSelect = (Select *)(p->x).pList;
  if ((uVar2 >> 0xc & 1) == 0) {
    if (pSelect != (Select *)0x0) {
      heightOfExprList((ExprList *)pSelect,&local_1c);
      uVar4._0_1_ = pSelect->op;
      uVar4._1_1_ = pSelect->field_0x1;
      uVar4._2_2_ = pSelect->nSelectRow;
      uVar3 = 0;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = uVar3;
      }
      uVar4 = 0;
      for (; uVar5 * 0x18 - uVar3 != 0; uVar3 = uVar3 + 0x18) {
        uVar4 = uVar4 | *(uint *)(*(long *)((long)pSelect->addrOpenEphm + (uVar3 - 0xc)) + 4);
      }
      p->flags = uVar4 & 0x400208 | uVar2;
    }
  }
  else {
    heightOfSelect(pSelect,&local_1c);
  }
  p->nHeight = local_1c + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = p->pLeft ? p->pLeft->nHeight : 0;
  if( p->pRight && p->pRight->nHeight>nHeight ) nHeight = p->pRight->nHeight;
  if( ExprUseXSelect(p) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}